

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *
tinyusdz::lerp<tinyusdz::value::color4f>
          (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *a,
          vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *b,double t)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pcVar8;
  pointer pcVar9;
  ulong uVar10;
  long lVar11;
  ulong __new_size;
  float fVar12;
  float fVar13;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (long)(a->
                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar10 <= __new_size) {
    __new_size = uVar10;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      fVar12 = (float)(1.0 - t);
      fVar13 = (float)t;
      lVar11 = 8;
      do {
        pcVar8 = (a->
                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar9 = (b->
                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar2 = *(float *)((long)pcVar8 + lVar11 + -4);
        fVar3 = *(float *)((long)&pcVar8->r + lVar11);
        fVar4 = *(float *)((long)&pcVar8->g + lVar11);
        fVar5 = *(float *)((long)pcVar9 + lVar11 + -4);
        fVar6 = *(float *)((long)&pcVar9->r + lVar11);
        fVar7 = *(float *)((long)&pcVar9->g + lVar11);
        pfVar1 = (float *)((long)(__return_storage_ptr__->
                                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
        *pfVar1 = *(float *)((long)pcVar9 + lVar11 + -8) * fVar13 +
                  *(float *)((long)pcVar8 + lVar11 + -8) * fVar12;
        pfVar1[1] = fVar5 * fVar13 + fVar2 * fVar12;
        pfVar1[2] = fVar6 * fVar13 + fVar3 * fVar12;
        pfVar1[3] = fVar7 * fVar13 + fVar4 * fVar12;
        lVar11 = lVar11 + 0x10;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}